

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void UA_Server_processSecureChannelMessage
               (UA_Server *server,UA_SecureChannel *channel,UA_MessageType messagetype,
               UA_UInt32 requestId,UA_ByteString *message)

{
  UA_Connection *connection;
  long lVar1;
  long lVar2;
  
  if (channel == (UA_SecureChannel *)0x0) {
    __assert_fail("channel",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                  ,0x442a,
                  "void UA_Server_processSecureChannelMessage(UA_Server *, UA_SecureChannel *, UA_MessageType, UA_UInt32, const UA_ByteString *)"
                 );
  }
  connection = channel->connection;
  if (connection == (UA_Connection *)0x0) {
    __assert_fail("channel->connection",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                  ,0x442b,
                  "void UA_Server_processSecureChannelMessage(UA_Server *, UA_SecureChannel *, UA_MessageType, UA_UInt32, const UA_ByteString *)"
                 );
  }
  if ((int)messagetype < 0x4f4c43) {
    if (messagetype == UA_MESSAGETYPE_MSG) {
      processMSG(server,channel,requestId,message);
      return;
    }
    if (messagetype == UA_MESSAGETYPE_OPN) {
      processOPN(server,connection,(channel->securityToken).channelId,message);
      return;
    }
  }
  else {
    if (messagetype == UA_MESSAGETYPE_CLO) {
      Service_CloseSecureChannel(server,channel);
      return;
    }
    if (messagetype == UA_MESSAGETYPE_ERR) {
      lVar2 = 0;
      lVar1 = 0x141ba0;
      do {
        if (*(int *)((long)&statusCodeDescriptions[0].code + lVar2) == (int)message->length) {
          lVar1 = (long)&statusCodeDescriptions[0].code + lVar2;
          break;
        }
        lVar2 = lVar2 + 0x18;
      } while (lVar2 != 0x1578);
      UA_LOG_ERROR((server->config).logger,UA_LOGCATEGORY_SECURECHANNEL,
                   "Connection %i | SecureChannel %i | Client replied with an error message: %s %.*s"
                   ,(ulong)(uint)connection->sockfd,(ulong)(channel->securityToken).channelId,
                   *(undefined8 *)(lVar1 + 8),*(undefined4 *)&message->data,(int)message[1].length);
    }
  }
  return;
}

Assistant:

static void
UA_Server_processSecureChannelMessage(UA_Server *server, UA_SecureChannel *channel,
                                      UA_MessageType messagetype, UA_UInt32 requestId,
                                      const UA_ByteString *message) {
    UA_assert(channel);
    UA_assert(channel->connection);
    switch(messagetype) {
    case UA_MESSAGETYPE_ERR: {
        const UA_TcpErrorMessage *msg = (const UA_TcpErrorMessage *) message;
        UA_LOG_ERROR_CHANNEL(server->config.logger, channel,
                             "Client replied with an error message: %s %.*s",
                             UA_StatusCode_name(msg->error), msg->reason.length, msg->reason.data);
        break;
    }
    case UA_MESSAGETYPE_HEL:
        UA_LOG_TRACE_CHANNEL(server->config.logger, channel,
                             "Cannot process a HEL on an open channel");
        break;
    case UA_MESSAGETYPE_OPN:
        UA_LOG_TRACE_CHANNEL(server->config.logger, channel,
                             "Process an OPN on an open channel");
        processOPN(server, channel->connection, channel->securityToken.channelId, message);
        break;
    case UA_MESSAGETYPE_MSG:
        UA_LOG_TRACE_CHANNEL(server->config.logger, channel,
                             "Process a MSG", channel->connection->sockfd);
        processMSG(server, channel, requestId, message);
        break;
    case UA_MESSAGETYPE_CLO:
        UA_LOG_TRACE_CHANNEL(server->config.logger, channel,
                             "Process a CLO", channel->connection->sockfd);
        Service_CloseSecureChannel(server, channel);
        break;
    default:
        UA_LOG_TRACE_CHANNEL(server->config.logger, channel,
                             "Unknown message type");
    }
}